

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segments.cpp
# Opt level: O0

void __thiscall r_comp::Image::add_sys_object(Image *this,SysObject *object)

{
  long lVar1;
  SysObject *object_local;
  Image *this_local;
  
  r_code::vector<r_code::SysObject_*>::push_back(&(this->code_segment).objects,object);
  r_code::vector<unsigned_int>::push_back(&(this->object_map).objects,(uint)this->map_offset);
  lVar1 = r_code::SysObject::get_size();
  this->map_offset = lVar1 + this->map_offset;
  return;
}

Assistant:

void Image::add_sys_object(SysObject *object)
{
    code_segment.objects.push_back(object);
    object_map.objects.push_back(map_offset);
    map_offset += object->get_size();
}